

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

reference __thiscall
QVLABase<QArgumentType>::emplace_back_impl<QArgumentType>
          (QVLABase<QArgumentType> *this,qsizetype prealloc,void *array,QArgumentType *args)

{
  qsizetype *pqVar1;
  long lVar2;
  QArgumentType *this_00;
  
  lVar2 = (this->super_QVLABaseBase).s;
  if (lVar2 == (this->super_QVLABaseBase).a) {
    growBy(this,prealloc,array,1);
    lVar2 = (this->super_QVLABaseBase).s;
  }
  this_00 = (QArgumentType *)(lVar2 * 0x20 + (long)(this->super_QVLABaseBase).ptr);
  QArgumentType::QArgumentType(this_00,args);
  pqVar1 = &(this->super_QVLABaseBase).s;
  *pqVar1 = *pqVar1 + 1;
  return this_00;
}

Assistant:

reference emplace_back_impl(qsizetype prealloc, void *array, Args&&...args)
    {
        if (size() == capacity()) // ie. size() != 0
            growBy(prealloc, array, 1);
        reference r = *q20::construct_at(end(), std::forward<Args>(args)...);
        ++s;
        return r;
    }